

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::generateBoard(Board *this)

{
  initializer_list<Move> __l;
  int iVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  value_type local_94;
  iterator iStack_90;
  Move move;
  Move local_88 [4];
  iterator local_78;
  undefined8 local_70;
  __normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_> local_68;
  const_iterator local_60;
  int local_58;
  int i;
  allocator<Move> local_41;
  undefined1 local_40 [8];
  vector<Move,_std::allocator<Move>_> moves;
  size_t emptyCol;
  size_t emptyRow;
  size_t emptyTile;
  Board *this_local;
  
  sVar2 = findEmptyTilePosition(this);
  emptyCol = sVar2 / 10;
  moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(sVar2 + (sVar2 / 5 & 0xfffffffffffffffe) * -5);
  std::allocator<Move>::allocator(&local_41);
  std::vector<Move,_std::allocator<Move>_>::vector
            ((vector<Move,_std::allocator<Move>_> *)local_40,4,&local_41);
  std::allocator<Move>::~allocator(&local_41);
  local_58 = 0;
  do {
    if (3999 < local_58) {
      std::vector<Move,_std::allocator<Move>_>::~vector
                ((vector<Move,_std::allocator<Move>_> *)local_40);
      return;
    }
    std::vector<Move,_std::allocator<Move>_>::clear((vector<Move,_std::allocator<Move>_> *)local_40)
    ;
    local_68._M_current =
         (Move *)std::vector<Move,_std::allocator<Move>_>::begin
                           ((vector<Move,_std::allocator<Move>_> *)local_40);
    __gnu_cxx::__normal_iterator<Move_const*,std::vector<Move,std::allocator<Move>>>::
    __normal_iterator<Move*>
              ((__normal_iterator<Move_const*,std::vector<Move,std::allocator<Move>>> *)&local_60,
               &local_68);
    local_88[0] = UP;
    local_88[1] = 1;
    local_88[2] = 2;
    local_88[3] = 3;
    local_78 = local_88;
    local_70 = 4;
    __l._M_len = 4;
    __l._M_array = local_78;
    iStack_90 = std::vector<Move,_std::allocator<Move>_>::insert
                          ((vector<Move,_std::allocator<Move>_> *)local_40,local_60,__l);
    iVar1 = rand();
    sVar3 = std::vector<Move,_std::allocator<Move>_>::size
                      ((vector<Move,_std::allocator<Move>_> *)local_40);
    pvVar4 = std::vector<Move,_std::allocator<Move>_>::at
                       ((vector<Move,_std::allocator<Move>_> *)local_40,(ulong)(long)iVar1 % sVar3);
    local_94 = *pvVar4;
    while( true ) {
      if ((local_94 == UP) && (emptyCol != 0)) {
        makeMove(this,emptyCol,
                 (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,emptyCol - 1,
                 (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        emptyCol = emptyCol - 1;
        goto LAB_0010e359;
      }
      if ((local_94 == RIGHT) &&
         (moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage < (pointer)(this->sizeInt - 1))) {
        makeMove(this,emptyCol,
                 (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,emptyCol,
                 (size_t)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1));
        moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 1);
        goto LAB_0010e359;
      }
      if ((local_94 == DOWN) && (emptyCol < this->sizeInt - 1)) {
        makeMove(this,emptyCol,
                 (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,emptyCol + 1,
                 (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        emptyCol = emptyCol + 1;
        goto LAB_0010e359;
      }
      if ((local_94 == LEFT) &&
         (moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0)) break;
      __first = std::vector<Move,_std::allocator<Move>_>::begin
                          ((vector<Move,_std::allocator<Move>_> *)local_40);
      __last = std::vector<Move,_std::allocator<Move>_>::end
                         ((vector<Move,_std::allocator<Move>_> *)local_40);
      std::remove<__gnu_cxx::__normal_iterator<Move*,std::vector<Move,std::allocator<Move>>>,Move>
                ((__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 __first._M_current,
                 (__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 __last._M_current,&local_94);
      iVar1 = rand();
      sVar3 = std::vector<Move,_std::allocator<Move>_>::size
                        ((vector<Move,_std::allocator<Move>_> *)local_40);
      pvVar4 = std::vector<Move,_std::allocator<Move>_>::operator[]
                         ((vector<Move,_std::allocator<Move>_> *)local_40,(ulong)(long)iVar1 % sVar3
                         );
      local_94 = *pvVar4;
    }
    makeMove(this,emptyCol,
             (size_t)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,emptyCol,
             (size_t)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - 1));
    moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + -1);
LAB_0010e359:
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void Board::generateBoard()
{
    size_t emptyTile = findEmptyTilePosition();
    size_t emptyRow = emptyTile / 10;
    size_t emptyCol = emptyTile % 10;

    std::vector<Move> moves( 4 );
    using enum Move;

    for ( int i = 0; i < 4000; i++ )
    {
        moves.clear();
        moves.insert( moves.begin(), { UP, RIGHT, DOWN, LEFT });
        Move move = moves.at( rand() % moves.size() );

        while( true )
        {
            if (( move == UP ) && ( emptyRow > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow - 1, emptyCol );
                emptyRow--;
                break;
            }
            if (( move == RIGHT ) && ( emptyCol < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol + 1 );
                emptyCol++;
                break;
            }
            if (( move == DOWN ) && ( emptyRow < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow + 1, emptyCol );
                emptyRow++;
                break;
            }
            if (( move == LEFT ) && ( emptyCol > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol - 1 );
                emptyCol--;
                break;
            }

            std::remove( moves.begin(), moves.end(), move );
            move = moves[ rand() % moves.size() ];
        }
    }
}